

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 (*pauVar31) [16];
  uint uVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  Scene *pSVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar52 [32];
  undefined1 auVar51 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar68 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float fVar82;
  float fVar83;
  undefined1 auVar79 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  float fVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [64];
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar107 [32];
  undefined4 uVar111;
  float fVar112;
  float fVar116;
  float fVar117;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar119;
  float fVar120;
  undefined1 auVar118 [32];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar122 [32];
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar127 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1560 [16];
  undefined1 (*local_1550) [16];
  long local_1548;
  ulong local_1540;
  ulong local_1538;
  RTCFilterFunctionNArguments local_1530;
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  float local_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float local_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float local_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  RTCHitN local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined4 local_1330;
  undefined4 uStack_132c;
  undefined4 uStack_1328;
  undefined4 uStack_1324;
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  uint local_1300;
  uint uStack_12fc;
  uint uStack_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  undefined1 local_12e0 [16];
  undefined4 uStack_12d0;
  undefined4 uStack_12cc;
  undefined4 uStack_12c8;
  undefined4 uStack_12c4;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  undefined4 uStack_1184;
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  undefined4 uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  undefined4 uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined4 uStack_1104;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar33 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar111 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_13b0._4_4_ = uVar111;
  local_13b0._0_4_ = uVar111;
  local_13b0._8_4_ = uVar111;
  local_13b0._12_4_ = uVar111;
  auVar93 = ZEXT1664(local_13b0);
  uVar111 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_13c0._4_4_ = uVar111;
  local_13c0._0_4_ = uVar111;
  local_13c0._8_4_ = uVar111;
  local_13c0._12_4_ = uVar111;
  auVar94 = ZEXT1664(local_13c0);
  uVar111 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_13d0._4_4_ = uVar111;
  local_13d0._0_4_ = uVar111;
  local_13d0._8_4_ = uVar111;
  local_13d0._12_4_ = uVar111;
  auVar99 = ZEXT1664(local_13d0);
  fStack_1404 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_1414 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fStack_1424 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_13d4 = fStack_1404 * 0.99999964;
  fStack_13e4 = fStack_1414 * 0.99999964;
  fStack_13f4 = fStack_1424 * 0.99999964;
  fStack_1404 = fStack_1404 * 1.0000004;
  fStack_1414 = fStack_1414 * 1.0000004;
  fStack_1424 = fStack_1424 * 1.0000004;
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1538 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1540 = uVar42 ^ 0x10;
  uVar44 = local_1538 ^ 0x10;
  iVar2 = (tray->tnear).field_0.i[k];
  local_14b0._4_4_ = iVar2;
  local_14b0._0_4_ = iVar2;
  local_14b0._8_4_ = iVar2;
  local_14b0._12_4_ = iVar2;
  auVar89 = ZEXT1664(local_14b0);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar49 = ZEXT1664(CONCAT412(iVar2,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))));
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  local_1550 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar70._8_4_ = 0x3f800000;
  auVar70._0_8_ = 0x3f8000003f800000;
  auVar70._12_4_ = 0x3f800000;
  auVar70._16_4_ = 0x3f800000;
  auVar70._20_4_ = 0x3f800000;
  auVar70._24_4_ = 0x3f800000;
  auVar70._28_4_ = 0x3f800000;
  auVar52._8_4_ = 0xbf800000;
  auVar52._0_8_ = 0xbf800000bf800000;
  auVar52._12_4_ = 0xbf800000;
  auVar52._16_4_ = 0xbf800000;
  auVar52._20_4_ = 0xbf800000;
  auVar52._24_4_ = 0xbf800000;
  auVar52._28_4_ = 0xbf800000;
  _local_1120 = vblendvps_avx(auVar70,auVar52,local_1100);
  fStack_13d8 = fStack_13d4;
  fStack_13dc = fStack_13d4;
  local_13e0 = fStack_13d4;
  fStack_13e8 = fStack_13e4;
  fStack_13ec = fStack_13e4;
  local_13f0 = fStack_13e4;
  fStack_13f8 = fStack_13f4;
  fStack_13fc = fStack_13f4;
  local_1400 = fStack_13f4;
  fStack_1408 = fStack_1404;
  fStack_140c = fStack_1404;
  local_1410 = fStack_1404;
  fStack_1418 = fStack_1414;
  fStack_141c = fStack_1414;
  local_1420 = fStack_1414;
  fStack_1428 = fStack_1424;
  fStack_142c = fStack_1424;
  local_1430 = fStack_1424;
  fVar130 = fStack_1424;
  fVar129 = fStack_1424;
  fVar128 = fStack_1424;
  fVar126 = fStack_1424;
  fVar125 = fStack_1414;
  fVar124 = fStack_1414;
  fVar123 = fStack_1414;
  fVar121 = fStack_1414;
  fVar120 = fStack_1404;
  fVar119 = fStack_1404;
  fVar87 = fStack_1404;
  fVar86 = fStack_1404;
  fVar85 = fStack_13f4;
  fVar84 = fStack_13f4;
  fVar83 = fStack_13f4;
  fVar82 = fStack_13f4;
  fVar95 = fStack_13e4;
  fVar117 = fStack_13e4;
  fVar116 = fStack_13e4;
  fVar112 = fStack_13e4;
  fVar110 = fStack_13d4;
  fVar109 = fStack_13d4;
  fVar108 = fStack_13d4;
  fVar106 = fStack_13d4;
LAB_00514d1c:
  do {
    pauVar31 = pauVar33 + -1;
    pauVar33 = pauVar33 + -1;
    if (*(float *)(*pauVar31 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar38 = *(ulong *)*pauVar33;
      while ((uVar38 & 8) == 0) {
        auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar42),auVar93._0_16_);
        auVar50._0_4_ = fVar106 * auVar51._0_4_;
        auVar50._4_4_ = fVar108 * auVar51._4_4_;
        auVar50._8_4_ = fVar109 * auVar51._8_4_;
        auVar50._12_4_ = fVar110 * auVar51._12_4_;
        auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + local_1538),auVar94._0_16_);
        auVar60._0_4_ = fVar112 * auVar51._0_4_;
        auVar60._4_4_ = fVar116 * auVar51._4_4_;
        auVar60._8_4_ = fVar117 * auVar51._8_4_;
        auVar60._12_4_ = fVar95 * auVar51._12_4_;
        auVar51 = vmaxps_avx(auVar50,auVar60);
        auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar43),auVar99._0_16_);
        auVar61._0_4_ = fVar82 * auVar50._0_4_;
        auVar61._4_4_ = fVar83 * auVar50._4_4_;
        auVar61._8_4_ = fVar84 * auVar50._8_4_;
        auVar61._12_4_ = fVar85 * auVar50._12_4_;
        auVar50 = vmaxps_avx(auVar61,auVar89._0_16_);
        local_12e0 = vmaxps_avx(auVar51,auVar50);
        auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + local_1540),auVar93._0_16_);
        auVar62._0_4_ = fVar86 * auVar51._0_4_;
        auVar62._4_4_ = fVar87 * auVar51._4_4_;
        auVar62._8_4_ = fVar119 * auVar51._8_4_;
        auVar62._12_4_ = fVar120 * auVar51._12_4_;
        auVar51 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar44),auVar94._0_16_);
        auVar66._0_4_ = fVar121 * auVar51._0_4_;
        auVar66._4_4_ = fVar123 * auVar51._4_4_;
        auVar66._8_4_ = fVar124 * auVar51._8_4_;
        auVar66._12_4_ = fVar125 * auVar51._12_4_;
        auVar51 = vminps_avx(auVar62,auVar66);
        auVar50 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar43 ^ 0x10)),auVar99._0_16_)
        ;
        auVar67._0_4_ = fVar126 * auVar50._0_4_;
        auVar67._4_4_ = fVar128 * auVar50._4_4_;
        auVar67._8_4_ = fVar129 * auVar50._8_4_;
        auVar67._12_4_ = fVar130 * auVar50._12_4_;
        auVar50 = vminps_avx(auVar67,auVar49._0_16_);
        auVar51 = vminps_avx(auVar51,auVar50);
        auVar51 = vcmpps_avx(local_12e0,auVar51,2);
        uVar36 = vmovmskps_avx(auVar51);
        if (uVar36 == 0) {
          if (pauVar33 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_00514d1c;
        }
        uVar36 = uVar36 & 0xff;
        uVar35 = uVar38 & 0xfffffffffffffff0;
        lVar39 = 0;
        for (uVar38 = (ulong)uVar36; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
          lVar39 = lVar39 + 1;
        }
        uVar38 = *(ulong *)(uVar35 + lVar39 * 8);
        uVar36 = uVar36 - 1 & uVar36;
        uVar37 = (ulong)uVar36;
        if (uVar36 != 0) {
          uVar32 = *(uint *)(local_12e0 + lVar39 * 4);
          lVar39 = 0;
          for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar39 = lVar39 + 1;
          }
          uVar36 = uVar36 - 1 & uVar36;
          uVar40 = (ulong)uVar36;
          uVar37 = *(ulong *)(uVar35 + lVar39 * 8);
          uVar4 = *(uint *)(local_12e0 + lVar39 * 4);
          if (uVar36 == 0) {
            if (uVar32 < uVar4) {
              *(ulong *)*pauVar33 = uVar37;
              *(uint *)(*pauVar33 + 8) = uVar4;
              pauVar33 = pauVar33 + 1;
            }
            else {
              *(ulong *)*pauVar33 = uVar38;
              *(uint *)(*pauVar33 + 8) = uVar32;
              pauVar33 = pauVar33 + 1;
              uVar38 = uVar37;
            }
          }
          else {
            auVar51._8_8_ = 0;
            auVar51._0_8_ = uVar38;
            auVar51 = vpunpcklqdq_avx(auVar51,ZEXT416(uVar32));
            auVar63._8_8_ = 0;
            auVar63._0_8_ = uVar37;
            auVar50 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar4));
            lVar39 = 0;
            for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
              lVar39 = lVar39 + 1;
            }
            uVar36 = uVar36 - 1 & uVar36;
            uVar38 = (ulong)uVar36;
            auVar68._8_8_ = 0;
            auVar68._0_8_ = *(ulong *)(uVar35 + lVar39 * 8);
            auVar61 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_12e0 + lVar39 * 4)));
            auVar60 = vpcmpgtd_avx(auVar50,auVar51);
            if (uVar36 == 0) {
              auVar62 = vpshufd_avx(auVar60,0xaa);
              auVar60 = vblendvps_avx(auVar50,auVar51,auVar62);
              auVar51 = vblendvps_avx(auVar51,auVar50,auVar62);
              auVar50 = vpcmpgtd_avx(auVar61,auVar60);
              auVar62 = vpshufd_avx(auVar50,0xaa);
              auVar50 = vblendvps_avx(auVar61,auVar60,auVar62);
              auVar60 = vblendvps_avx(auVar60,auVar61,auVar62);
              auVar61 = vpcmpgtd_avx(auVar60,auVar51);
              auVar62 = vpshufd_avx(auVar61,0xaa);
              auVar61 = vblendvps_avx(auVar60,auVar51,auVar62);
              auVar51 = vblendvps_avx(auVar51,auVar60,auVar62);
              *pauVar33 = auVar51;
              pauVar33[1] = auVar61;
              uVar38 = auVar50._0_8_;
              pauVar33 = pauVar33 + 2;
            }
            else {
              lVar39 = 0;
              for (; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                lVar39 = lVar39 + 1;
              }
              auVar79._8_8_ = 0;
              auVar79._0_8_ = *(ulong *)(uVar35 + lVar39 * 8);
              auVar66 = vpunpcklqdq_avx(auVar79,ZEXT416(*(uint *)(local_12e0 + lVar39 * 4)));
              auVar62 = vpshufd_avx(auVar60,0xaa);
              auVar60 = vblendvps_avx(auVar50,auVar51,auVar62);
              auVar51 = vblendvps_avx(auVar51,auVar50,auVar62);
              auVar50 = vpcmpgtd_avx(auVar66,auVar61);
              auVar62 = vpshufd_avx(auVar50,0xaa);
              auVar50 = vblendvps_avx(auVar66,auVar61,auVar62);
              auVar61 = vblendvps_avx(auVar61,auVar66,auVar62);
              auVar62 = vpcmpgtd_avx(auVar61,auVar51);
              auVar66 = vpshufd_avx(auVar62,0xaa);
              auVar62 = vblendvps_avx(auVar61,auVar51,auVar66);
              auVar51 = vblendvps_avx(auVar51,auVar61,auVar66);
              auVar61 = vpcmpgtd_avx(auVar50,auVar60);
              auVar66 = vpshufd_avx(auVar61,0xaa);
              auVar61 = vblendvps_avx(auVar50,auVar60,auVar66);
              auVar50 = vblendvps_avx(auVar60,auVar50,auVar66);
              auVar60 = vpcmpgtd_avx(auVar62,auVar50);
              auVar66 = vpshufd_avx(auVar60,0xaa);
              auVar60 = vblendvps_avx(auVar62,auVar50,auVar66);
              auVar50 = vblendvps_avx(auVar50,auVar62,auVar66);
              *pauVar33 = auVar51;
              pauVar33[1] = auVar50;
              pauVar33[2] = auVar60;
              auVar89 = ZEXT1664(local_14b0);
              uVar38 = auVar61._0_8_;
              pauVar33 = pauVar33 + 3;
            }
          }
        }
      }
      local_1548 = (ulong)((uint)uVar38 & 0xf) - 8;
      if (local_1548 != 0) {
        uVar38 = uVar38 & 0xfffffffffffffff0;
        lVar39 = 0;
        do {
          lVar34 = lVar39 * 0xe0;
          lVar1 = uVar38 + 0xd0 + lVar34;
          local_13a0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_1398 = *(undefined8 *)(lVar1 + 0x18);
          lVar1 = uVar38 + 0xc0 + lVar34;
          local_fc0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_fb8 = *(undefined8 *)(lVar1 + 0x18);
          uStack_fb0 = local_fc0;
          uStack_fa8 = uStack_fb8;
          uStack_1390 = local_13a0;
          uStack_1388 = uStack_1398;
          auVar71._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x60 + lVar34);
          auVar71._0_16_ = *(undefined1 (*) [16])(uVar38 + lVar34);
          auVar53._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x70 + lVar34);
          auVar53._0_16_ = *(undefined1 (*) [16])(uVar38 + 0x10 + lVar34);
          auVar64._16_16_ = *(undefined1 (*) [16])(uVar38 + 0x80 + lVar34);
          auVar64._0_16_ = *(undefined1 (*) [16])(uVar38 + 0x20 + lVar34);
          auVar51 = *(undefined1 (*) [16])(uVar38 + 0x30 + lVar34);
          auVar88._16_16_ = auVar51;
          auVar88._0_16_ = auVar51;
          auVar51 = *(undefined1 (*) [16])(uVar38 + 0x40 + lVar34);
          auVar74._16_16_ = auVar51;
          auVar74._0_16_ = auVar51;
          auVar51 = *(undefined1 (*) [16])(uVar38 + 0x50 + lVar34);
          auVar80._16_16_ = auVar51;
          auVar80._0_16_ = auVar51;
          auVar51 = *(undefined1 (*) [16])(uVar38 + 0x90 + lVar34);
          auVar90._16_16_ = auVar51;
          auVar90._0_16_ = auVar51;
          auVar51 = *(undefined1 (*) [16])(uVar38 + 0xa0 + lVar34);
          auVar127._16_16_ = auVar51;
          auVar127._0_16_ = auVar51;
          auVar51 = *(undefined1 (*) [16])(uVar38 + 0xb0 + lVar34);
          auVar46._16_16_ = auVar51;
          auVar46._0_16_ = auVar51;
          uVar111 = *(undefined4 *)(ray + k * 4);
          auVar113._4_4_ = uVar111;
          auVar113._0_4_ = uVar111;
          auVar113._8_4_ = uVar111;
          auVar113._12_4_ = uVar111;
          auVar113._16_4_ = uVar111;
          auVar113._20_4_ = uVar111;
          auVar113._24_4_ = uVar111;
          auVar113._28_4_ = uVar111;
          uVar111 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar118._4_4_ = uVar111;
          auVar118._0_4_ = uVar111;
          auVar118._8_4_ = uVar111;
          auVar118._12_4_ = uVar111;
          auVar118._16_4_ = uVar111;
          auVar118._20_4_ = uVar111;
          auVar118._24_4_ = uVar111;
          auVar118._28_4_ = uVar111;
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar122._4_4_ = uVar3;
          auVar122._0_4_ = uVar3;
          auVar122._8_4_ = uVar3;
          auVar122._12_4_ = uVar3;
          auVar122._16_4_ = uVar3;
          auVar122._20_4_ = uVar3;
          auVar122._24_4_ = uVar3;
          auVar122._28_4_ = uVar3;
          local_1500 = vsubps_avx(auVar71,auVar113);
          auVar53 = vsubps_avx(auVar53,auVar118);
          auVar52 = vsubps_avx(auVar64,auVar122);
          auVar70 = vsubps_avx(auVar88,auVar113);
          auVar58 = vsubps_avx(auVar74,auVar118);
          auVar12 = vsubps_avx(auVar80,auVar122);
          auVar64 = vsubps_avx(auVar90,auVar113);
          auVar71 = vsubps_avx(auVar127,auVar118);
          auVar13 = vsubps_avx(auVar46,auVar122);
          local_14a0 = vsubps_avx(auVar64,local_1500);
          local_1000 = vsubps_avx(auVar71,auVar53);
          local_fe0 = vsubps_avx(auVar13,auVar52);
          auVar47._0_4_ = local_1500._0_4_ + auVar64._0_4_;
          auVar47._4_4_ = local_1500._4_4_ + auVar64._4_4_;
          auVar47._8_4_ = local_1500._8_4_ + auVar64._8_4_;
          auVar47._12_4_ = local_1500._12_4_ + auVar64._12_4_;
          auVar47._16_4_ = local_1500._16_4_ + auVar64._16_4_;
          auVar47._20_4_ = local_1500._20_4_ + auVar64._20_4_;
          auVar47._24_4_ = local_1500._24_4_ + auVar64._24_4_;
          auVar47._28_4_ = local_1500._28_4_ + auVar64._28_4_;
          auVar91._0_4_ = auVar71._0_4_ + auVar53._0_4_;
          auVar91._4_4_ = auVar71._4_4_ + auVar53._4_4_;
          auVar91._8_4_ = auVar71._8_4_ + auVar53._8_4_;
          auVar91._12_4_ = auVar71._12_4_ + auVar53._12_4_;
          auVar91._16_4_ = auVar71._16_4_ + auVar53._16_4_;
          auVar91._20_4_ = auVar71._20_4_ + auVar53._20_4_;
          auVar91._24_4_ = auVar71._24_4_ + auVar53._24_4_;
          auVar91._28_4_ = auVar71._28_4_ + auVar53._28_4_;
          fVar106 = auVar52._0_4_;
          auVar75._0_4_ = auVar13._0_4_ + fVar106;
          fVar108 = auVar52._4_4_;
          auVar75._4_4_ = auVar13._4_4_ + fVar108;
          fVar109 = auVar52._8_4_;
          auVar75._8_4_ = auVar13._8_4_ + fVar109;
          fVar110 = auVar52._12_4_;
          auVar75._12_4_ = auVar13._12_4_ + fVar110;
          fVar112 = auVar52._16_4_;
          auVar75._16_4_ = auVar13._16_4_ + fVar112;
          fVar116 = auVar52._20_4_;
          auVar75._20_4_ = auVar13._20_4_ + fVar116;
          fVar117 = auVar52._24_4_;
          auVar75._24_4_ = auVar13._24_4_ + fVar117;
          fVar100 = auVar13._28_4_;
          auVar75._28_4_ = fVar100 + auVar52._28_4_;
          auVar14._4_4_ = local_fe0._4_4_ * auVar91._4_4_;
          auVar14._0_4_ = local_fe0._0_4_ * auVar91._0_4_;
          auVar14._8_4_ = local_fe0._8_4_ * auVar91._8_4_;
          auVar14._12_4_ = local_fe0._12_4_ * auVar91._12_4_;
          auVar14._16_4_ = local_fe0._16_4_ * auVar91._16_4_;
          auVar14._20_4_ = local_fe0._20_4_ * auVar91._20_4_;
          auVar14._24_4_ = local_fe0._24_4_ * auVar91._24_4_;
          auVar14._28_4_ = uVar111;
          auVar50 = vfmsub231ps_fma(auVar14,local_1000,auVar75);
          auVar15._4_4_ = local_14a0._4_4_ * auVar75._4_4_;
          auVar15._0_4_ = local_14a0._0_4_ * auVar75._0_4_;
          auVar15._8_4_ = local_14a0._8_4_ * auVar75._8_4_;
          auVar15._12_4_ = local_14a0._12_4_ * auVar75._12_4_;
          auVar15._16_4_ = local_14a0._16_4_ * auVar75._16_4_;
          auVar15._20_4_ = local_14a0._20_4_ * auVar75._20_4_;
          auVar15._24_4_ = local_14a0._24_4_ * auVar75._24_4_;
          auVar15._28_4_ = auVar75._28_4_;
          auVar51 = vfmsub231ps_fma(auVar15,local_fe0,auVar47);
          auVar16._4_4_ = local_1000._4_4_ * auVar47._4_4_;
          auVar16._0_4_ = local_1000._0_4_ * auVar47._0_4_;
          auVar16._8_4_ = local_1000._8_4_ * auVar47._8_4_;
          auVar16._12_4_ = local_1000._12_4_ * auVar47._12_4_;
          auVar16._16_4_ = local_1000._16_4_ * auVar47._16_4_;
          auVar16._20_4_ = local_1000._20_4_ * auVar47._20_4_;
          auVar16._24_4_ = local_1000._24_4_ * auVar47._24_4_;
          auVar16._28_4_ = auVar47._28_4_;
          auVar60 = vfmsub231ps_fma(auVar16,local_14a0,auVar91);
          uVar111 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar114._4_4_ = uVar111;
          auVar114._0_4_ = uVar111;
          auVar114._8_4_ = uVar111;
          auVar114._12_4_ = uVar111;
          auVar114._16_4_ = uVar111;
          auVar114._20_4_ = uVar111;
          auVar114._24_4_ = uVar111;
          auVar114._28_4_ = uVar111;
          local_1040 = *(float *)(ray + k * 4 + 0x60);
          auVar17._4_4_ = local_1040 * auVar60._4_4_;
          auVar17._0_4_ = local_1040 * auVar60._0_4_;
          auVar17._8_4_ = local_1040 * auVar60._8_4_;
          auVar17._12_4_ = local_1040 * auVar60._12_4_;
          auVar17._16_4_ = local_1040 * 0.0;
          auVar17._20_4_ = local_1040 * 0.0;
          auVar17._24_4_ = local_1040 * 0.0;
          auVar17._28_4_ = fVar100;
          auVar51 = vfmadd231ps_fma(auVar17,auVar114,ZEXT1632(auVar51));
          uVar111 = *(undefined4 *)(ray + k * 4 + 0x40);
          local_1020._4_4_ = uVar111;
          local_1020._0_4_ = uVar111;
          local_1020._8_4_ = uVar111;
          local_1020._12_4_ = uVar111;
          local_1020._16_4_ = uVar111;
          local_1020._20_4_ = uVar111;
          local_1020._24_4_ = uVar111;
          local_1020._28_4_ = uVar111;
          local_12e0 = vfmadd231ps_fma(ZEXT1632(auVar51),local_1020,ZEXT1632(auVar50));
          local_1060 = vsubps_avx(auVar53,auVar58);
          local_1080 = vsubps_avx(auVar52,auVar12);
          auVar54._0_4_ = auVar58._0_4_ + auVar53._0_4_;
          auVar54._4_4_ = auVar58._4_4_ + auVar53._4_4_;
          auVar54._8_4_ = auVar58._8_4_ + auVar53._8_4_;
          auVar54._12_4_ = auVar58._12_4_ + auVar53._12_4_;
          auVar54._16_4_ = auVar58._16_4_ + auVar53._16_4_;
          auVar54._20_4_ = auVar58._20_4_ + auVar53._20_4_;
          auVar54._24_4_ = auVar58._24_4_ + auVar53._24_4_;
          auVar54._28_4_ = auVar58._28_4_ + auVar53._28_4_;
          auVar76._0_4_ = fVar106 + auVar12._0_4_;
          auVar76._4_4_ = fVar108 + auVar12._4_4_;
          auVar76._8_4_ = fVar109 + auVar12._8_4_;
          auVar76._12_4_ = fVar110 + auVar12._12_4_;
          auVar76._16_4_ = fVar112 + auVar12._16_4_;
          auVar76._20_4_ = fVar116 + auVar12._20_4_;
          auVar76._24_4_ = fVar117 + auVar12._24_4_;
          fVar95 = auVar12._28_4_;
          auVar76._28_4_ = auVar52._28_4_ + fVar95;
          fVar82 = local_1080._0_4_;
          fVar85 = local_1080._4_4_;
          auVar18._4_4_ = auVar54._4_4_ * fVar85;
          auVar18._0_4_ = auVar54._0_4_ * fVar82;
          fVar119 = local_1080._8_4_;
          auVar18._8_4_ = auVar54._8_4_ * fVar119;
          fVar123 = local_1080._12_4_;
          auVar18._12_4_ = auVar54._12_4_ * fVar123;
          fVar126 = local_1080._16_4_;
          auVar18._16_4_ = auVar54._16_4_ * fVar126;
          fVar130 = local_1080._20_4_;
          auVar18._20_4_ = auVar54._20_4_ * fVar130;
          fVar9 = local_1080._24_4_;
          auVar18._24_4_ = auVar54._24_4_ * fVar9;
          auVar18._28_4_ = auVar91._28_4_;
          auVar50 = vfmsub231ps_fma(auVar18,local_1060,auVar76);
          local_10a0 = vsubps_avx(local_1500,auVar70);
          fVar83 = local_10a0._0_4_;
          fVar86 = local_10a0._4_4_;
          auVar19._4_4_ = auVar76._4_4_ * fVar86;
          auVar19._0_4_ = auVar76._0_4_ * fVar83;
          fVar120 = local_10a0._8_4_;
          auVar19._8_4_ = auVar76._8_4_ * fVar120;
          fVar124 = local_10a0._12_4_;
          auVar19._12_4_ = auVar76._12_4_ * fVar124;
          fVar128 = local_10a0._16_4_;
          auVar19._16_4_ = auVar76._16_4_ * fVar128;
          fVar7 = local_10a0._20_4_;
          auVar19._20_4_ = auVar76._20_4_ * fVar7;
          fVar10 = local_10a0._24_4_;
          auVar19._24_4_ = auVar76._24_4_ * fVar10;
          auVar19._28_4_ = auVar76._28_4_;
          auVar96._0_4_ = local_1500._0_4_ + auVar70._0_4_;
          auVar96._4_4_ = local_1500._4_4_ + auVar70._4_4_;
          auVar96._8_4_ = local_1500._8_4_ + auVar70._8_4_;
          auVar96._12_4_ = local_1500._12_4_ + auVar70._12_4_;
          auVar96._16_4_ = local_1500._16_4_ + auVar70._16_4_;
          auVar96._20_4_ = local_1500._20_4_ + auVar70._20_4_;
          auVar96._24_4_ = local_1500._24_4_ + auVar70._24_4_;
          auVar96._28_4_ = local_1500._28_4_ + auVar70._28_4_;
          auVar51 = vfmsub231ps_fma(auVar19,local_1080,auVar96);
          fVar84 = local_1060._0_4_;
          fVar87 = local_1060._4_4_;
          auVar20._4_4_ = auVar96._4_4_ * fVar87;
          auVar20._0_4_ = auVar96._0_4_ * fVar84;
          fVar121 = local_1060._8_4_;
          auVar20._8_4_ = auVar96._8_4_ * fVar121;
          fVar125 = local_1060._12_4_;
          auVar20._12_4_ = auVar96._12_4_ * fVar125;
          fVar129 = local_1060._16_4_;
          auVar20._16_4_ = auVar96._16_4_ * fVar129;
          fVar8 = local_1060._20_4_;
          auVar20._20_4_ = auVar96._20_4_ * fVar8;
          fVar11 = local_1060._24_4_;
          auVar20._24_4_ = auVar96._24_4_ * fVar11;
          auVar20._28_4_ = auVar96._28_4_;
          auVar60 = vfmsub231ps_fma(auVar20,local_10a0,auVar54);
          auVar97._0_4_ = auVar60._0_4_ * local_1040;
          auVar97._4_4_ = auVar60._4_4_ * local_1040;
          auVar97._8_4_ = auVar60._8_4_ * local_1040;
          auVar97._12_4_ = auVar60._12_4_ * local_1040;
          auVar97._16_4_ = local_1040 * 0.0;
          auVar97._20_4_ = local_1040 * 0.0;
          auVar97._24_4_ = local_1040 * 0.0;
          auVar97._28_4_ = 0;
          auVar51 = vfmadd231ps_fma(auVar97,auVar114,ZEXT1632(auVar51));
          auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),local_1020,ZEXT1632(auVar50));
          auVar14 = vsubps_avx(auVar70,auVar64);
          auVar72._0_4_ = auVar70._0_4_ + auVar64._0_4_;
          auVar72._4_4_ = auVar70._4_4_ + auVar64._4_4_;
          auVar72._8_4_ = auVar70._8_4_ + auVar64._8_4_;
          auVar72._12_4_ = auVar70._12_4_ + auVar64._12_4_;
          auVar72._16_4_ = auVar70._16_4_ + auVar64._16_4_;
          auVar72._20_4_ = auVar70._20_4_ + auVar64._20_4_;
          auVar72._24_4_ = auVar70._24_4_ + auVar64._24_4_;
          auVar72._28_4_ = auVar70._28_4_ + auVar64._28_4_;
          auVar64 = vsubps_avx(auVar58,auVar71);
          auVar81._0_4_ = auVar58._0_4_ + auVar71._0_4_;
          auVar81._4_4_ = auVar58._4_4_ + auVar71._4_4_;
          auVar81._8_4_ = auVar58._8_4_ + auVar71._8_4_;
          auVar81._12_4_ = auVar58._12_4_ + auVar71._12_4_;
          auVar81._16_4_ = auVar58._16_4_ + auVar71._16_4_;
          auVar81._20_4_ = auVar58._20_4_ + auVar71._20_4_;
          auVar81._24_4_ = auVar58._24_4_ + auVar71._24_4_;
          auVar81._28_4_ = auVar58._28_4_ + auVar71._28_4_;
          auVar71 = vsubps_avx(auVar12,auVar13);
          auVar55._0_4_ = auVar12._0_4_ + auVar13._0_4_;
          auVar55._4_4_ = auVar12._4_4_ + auVar13._4_4_;
          auVar55._8_4_ = auVar12._8_4_ + auVar13._8_4_;
          auVar55._12_4_ = auVar12._12_4_ + auVar13._12_4_;
          auVar55._16_4_ = auVar12._16_4_ + auVar13._16_4_;
          auVar55._20_4_ = auVar12._20_4_ + auVar13._20_4_;
          auVar55._24_4_ = auVar12._24_4_ + auVar13._24_4_;
          auVar55._28_4_ = fVar95 + fVar100;
          auVar58._4_4_ = auVar71._4_4_ * auVar81._4_4_;
          auVar58._0_4_ = auVar71._0_4_ * auVar81._0_4_;
          auVar58._8_4_ = auVar71._8_4_ * auVar81._8_4_;
          auVar58._12_4_ = auVar71._12_4_ * auVar81._12_4_;
          auVar58._16_4_ = auVar71._16_4_ * auVar81._16_4_;
          auVar58._20_4_ = auVar71._20_4_ * auVar81._20_4_;
          auVar58._24_4_ = auVar71._24_4_ * auVar81._24_4_;
          auVar58._28_4_ = fVar95;
          auVar60 = vfmsub231ps_fma(auVar58,auVar64,auVar55);
          auVar12._4_4_ = auVar55._4_4_ * auVar14._4_4_;
          auVar12._0_4_ = auVar55._0_4_ * auVar14._0_4_;
          auVar12._8_4_ = auVar55._8_4_ * auVar14._8_4_;
          auVar12._12_4_ = auVar55._12_4_ * auVar14._12_4_;
          auVar12._16_4_ = auVar55._16_4_ * auVar14._16_4_;
          auVar12._20_4_ = auVar55._20_4_ * auVar14._20_4_;
          auVar12._24_4_ = auVar55._24_4_ * auVar14._24_4_;
          auVar12._28_4_ = auVar55._28_4_;
          auVar50 = vfmsub231ps_fma(auVar12,auVar71,auVar72);
          auVar13._4_4_ = auVar64._4_4_ * auVar72._4_4_;
          auVar13._0_4_ = auVar64._0_4_ * auVar72._0_4_;
          auVar13._8_4_ = auVar64._8_4_ * auVar72._8_4_;
          auVar13._12_4_ = auVar64._12_4_ * auVar72._12_4_;
          auVar13._16_4_ = auVar64._16_4_ * auVar72._16_4_;
          auVar13._20_4_ = auVar64._20_4_ * auVar72._20_4_;
          auVar13._24_4_ = auVar64._24_4_ * auVar72._24_4_;
          auVar13._28_4_ = auVar72._28_4_;
          auVar61 = vfmsub231ps_fma(auVar13,auVar14,auVar81);
          fStack_103c = local_1040;
          fStack_1038 = local_1040;
          fStack_1034 = local_1040;
          fStack_1030 = local_1040;
          fStack_102c = local_1040;
          fStack_1028 = local_1040;
          fStack_1024 = local_1040;
          auVar73._0_4_ = local_1040 * auVar61._0_4_;
          auVar73._4_4_ = local_1040 * auVar61._4_4_;
          auVar73._8_4_ = local_1040 * auVar61._8_4_;
          auVar73._12_4_ = local_1040 * auVar61._12_4_;
          auVar73._16_4_ = local_1040 * 0.0;
          auVar73._20_4_ = local_1040 * 0.0;
          auVar73._24_4_ = local_1040 * 0.0;
          auVar73._28_4_ = 0;
          auVar50 = vfmadd231ps_fma(auVar73,auVar114,ZEXT1632(auVar50));
          auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),local_1020,ZEXT1632(auVar60));
          local_12c0 = ZEXT1632(auVar51);
          local_12a0 = ZEXT1632(CONCAT412(auVar50._12_4_ + auVar51._12_4_ + local_12e0._12_4_,
                                          CONCAT48(auVar50._8_4_ + auVar51._8_4_ + local_12e0._8_4_,
                                                   CONCAT44(auVar50._4_4_ +
                                                            auVar51._4_4_ + local_12e0._4_4_,
                                                            auVar50._0_4_ +
                                                            auVar51._0_4_ + local_12e0._0_4_))));
          auVar56._8_4_ = 0x7fffffff;
          auVar56._0_8_ = 0x7fffffff7fffffff;
          auVar56._12_4_ = 0x7fffffff;
          auVar56._16_4_ = 0x7fffffff;
          auVar56._20_4_ = 0x7fffffff;
          auVar56._24_4_ = 0x7fffffff;
          auVar56._28_4_ = 0x7fffffff;
          auVar52 = vminps_avx(ZEXT1632(local_12e0),local_12c0);
          auVar52 = vminps_avx(auVar52,ZEXT1632(auVar50));
          local_10e0 = vandps_avx(local_12a0,auVar56);
          fVar95 = local_10e0._0_4_ * 1.1920929e-07;
          fVar100 = local_10e0._4_4_ * 1.1920929e-07;
          auVar21._4_4_ = fVar100;
          auVar21._0_4_ = fVar95;
          fVar101 = local_10e0._8_4_ * 1.1920929e-07;
          auVar21._8_4_ = fVar101;
          fVar102 = local_10e0._12_4_ * 1.1920929e-07;
          auVar21._12_4_ = fVar102;
          fVar103 = local_10e0._16_4_ * 1.1920929e-07;
          auVar21._16_4_ = fVar103;
          fVar104 = local_10e0._20_4_ * 1.1920929e-07;
          auVar21._20_4_ = fVar104;
          fVar105 = local_10e0._24_4_ * 1.1920929e-07;
          auVar21._24_4_ = fVar105;
          auVar21._28_4_ = 0x34000000;
          auVar92._0_8_ = CONCAT44(fVar100,fVar95) ^ 0x8000000080000000;
          auVar92._8_4_ = -fVar101;
          auVar92._12_4_ = -fVar102;
          auVar92._16_4_ = -fVar103;
          auVar92._20_4_ = -fVar104;
          auVar92._24_4_ = -fVar105;
          auVar92._28_4_ = 0xb4000000;
          auVar52 = vcmpps_avx(auVar52,auVar92,5);
          local_10c0 = ZEXT1632(local_12e0);
          auVar58 = vmaxps_avx(ZEXT1632(local_12e0),local_12c0);
          auVar70 = vmaxps_avx(auVar58,ZEXT1632(auVar50));
          auVar70 = vcmpps_avx(auVar70,auVar21,2);
          auVar70 = vorps_avx(auVar52,auVar70);
          if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar70 >> 0x7f,0) != '\0') ||
                (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar70 >> 0xbf,0) != '\0') ||
              (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar70[0x1f] < '\0') {
            auVar22._4_4_ = fVar87 * local_fe0._4_4_;
            auVar22._0_4_ = fVar84 * local_fe0._0_4_;
            auVar22._8_4_ = fVar121 * local_fe0._8_4_;
            auVar22._12_4_ = fVar125 * local_fe0._12_4_;
            auVar22._16_4_ = fVar129 * local_fe0._16_4_;
            auVar22._20_4_ = fVar8 * local_fe0._20_4_;
            auVar22._24_4_ = fVar11 * local_fe0._24_4_;
            auVar22._28_4_ = auVar52._28_4_;
            auVar23._4_4_ = fVar86 * local_1000._4_4_;
            auVar23._0_4_ = fVar83 * local_1000._0_4_;
            auVar23._8_4_ = fVar120 * local_1000._8_4_;
            auVar23._12_4_ = fVar124 * local_1000._12_4_;
            auVar23._16_4_ = fVar128 * local_1000._16_4_;
            auVar23._20_4_ = fVar7 * local_1000._20_4_;
            auVar23._24_4_ = fVar10 * local_1000._24_4_;
            auVar23._28_4_ = 0x34000000;
            auVar50 = vfmsub213ps_fma(local_1000,local_1080,auVar22);
            auVar24._4_4_ = auVar64._4_4_ * fVar85;
            auVar24._0_4_ = auVar64._0_4_ * fVar82;
            auVar24._8_4_ = auVar64._8_4_ * fVar119;
            auVar24._12_4_ = auVar64._12_4_ * fVar123;
            auVar24._16_4_ = auVar64._16_4_ * fVar126;
            auVar24._20_4_ = auVar64._20_4_ * fVar130;
            auVar24._24_4_ = auVar64._24_4_ * fVar9;
            auVar24._28_4_ = auVar58._28_4_;
            auVar25._4_4_ = fVar86 * auVar71._4_4_;
            auVar25._0_4_ = fVar83 * auVar71._0_4_;
            auVar25._8_4_ = fVar120 * auVar71._8_4_;
            auVar25._12_4_ = fVar124 * auVar71._12_4_;
            auVar25._16_4_ = fVar128 * auVar71._16_4_;
            auVar25._20_4_ = fVar7 * auVar71._20_4_;
            auVar25._24_4_ = fVar10 * auVar71._24_4_;
            auVar25._28_4_ = local_10e0._28_4_;
            auVar60 = vfmsub213ps_fma(auVar71,local_1060,auVar24);
            auVar52 = vandps_avx(auVar22,auVar56);
            auVar58 = vandps_avx(auVar24,auVar56);
            auVar52 = vcmpps_avx(auVar52,auVar58,1);
            local_1280 = vblendvps_avx(ZEXT1632(auVar60),ZEXT1632(auVar50),auVar52);
            auVar26._4_4_ = fVar87 * auVar14._4_4_;
            auVar26._0_4_ = fVar84 * auVar14._0_4_;
            auVar26._8_4_ = fVar121 * auVar14._8_4_;
            auVar26._12_4_ = fVar125 * auVar14._12_4_;
            auVar26._16_4_ = fVar129 * auVar14._16_4_;
            auVar26._20_4_ = fVar8 * auVar14._20_4_;
            auVar26._24_4_ = fVar11 * auVar14._24_4_;
            auVar26._28_4_ = auVar52._28_4_;
            auVar50 = vfmsub213ps_fma(auVar14,local_1080,auVar25);
            auVar27._4_4_ = local_14a0._4_4_ * fVar85;
            auVar27._0_4_ = local_14a0._0_4_ * fVar82;
            auVar27._8_4_ = local_14a0._8_4_ * fVar119;
            auVar27._12_4_ = local_14a0._12_4_ * fVar123;
            auVar27._16_4_ = local_14a0._16_4_ * fVar126;
            auVar27._20_4_ = local_14a0._20_4_ * fVar130;
            auVar27._24_4_ = local_14a0._24_4_ * fVar9;
            auVar27._28_4_ = auVar58._28_4_;
            auVar60 = vfmsub213ps_fma(local_fe0,local_10a0,auVar27);
            auVar52 = vandps_avx(auVar27,auVar56);
            auVar58 = vandps_avx(auVar25,auVar56);
            auVar52 = vcmpps_avx(auVar52,auVar58,1);
            local_1260 = vblendvps_avx(ZEXT1632(auVar50),ZEXT1632(auVar60),auVar52);
            auVar50 = vfmsub213ps_fma(local_14a0,local_1060,auVar23);
            auVar60 = vfmsub213ps_fma(auVar64,local_10a0,auVar26);
            auVar52 = vandps_avx(auVar23,auVar56);
            auVar58 = vandps_avx(auVar26,auVar56);
            auVar58 = vcmpps_avx(auVar52,auVar58,1);
            local_1240 = vblendvps_avx(ZEXT1632(auVar60),ZEXT1632(auVar50),auVar58);
            auVar50 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
            fVar95 = local_1240._0_4_;
            auVar57._0_4_ = fVar95 * local_1040;
            fVar82 = local_1240._4_4_;
            auVar57._4_4_ = fVar82 * local_1040;
            fVar83 = local_1240._8_4_;
            auVar57._8_4_ = fVar83 * local_1040;
            fVar84 = local_1240._12_4_;
            auVar57._12_4_ = fVar84 * local_1040;
            fVar85 = local_1240._16_4_;
            auVar57._16_4_ = fVar85 * local_1040;
            fVar86 = local_1240._20_4_;
            auVar57._20_4_ = fVar86 * local_1040;
            fVar87 = local_1240._24_4_;
            auVar57._24_4_ = fVar87 * local_1040;
            auVar57._28_4_ = 0;
            auVar60 = vfmadd213ps_fma(auVar114,local_1260,auVar57);
            auVar60 = vfmadd213ps_fma(local_1020,local_1280,ZEXT1632(auVar60));
            auVar58 = ZEXT1632(CONCAT412(auVar60._12_4_ + auVar60._12_4_,
                                         CONCAT48(auVar60._8_4_ + auVar60._8_4_,
                                                  CONCAT44(auVar60._4_4_ + auVar60._4_4_,
                                                           auVar60._0_4_ + auVar60._0_4_))));
            auVar28._4_4_ = fVar82 * fVar108;
            auVar28._0_4_ = fVar95 * fVar106;
            auVar28._8_4_ = fVar83 * fVar109;
            auVar28._12_4_ = fVar84 * fVar110;
            auVar28._16_4_ = fVar85 * fVar112;
            auVar28._20_4_ = fVar86 * fVar116;
            auVar28._24_4_ = fVar87 * fVar117;
            auVar28._28_4_ = auVar52._28_4_;
            auVar60 = vfmadd213ps_fma(auVar53,local_1260,auVar28);
            auVar61 = vfmadd213ps_fma(local_1500,local_1280,ZEXT1632(auVar60));
            auVar52 = vrcpps_avx(auVar58);
            auVar107._8_4_ = 0x3f800000;
            auVar107._0_8_ = 0x3f8000003f800000;
            auVar107._12_4_ = 0x3f800000;
            auVar107._16_4_ = 0x3f800000;
            auVar107._20_4_ = 0x3f800000;
            auVar107._24_4_ = 0x3f800000;
            auVar107._28_4_ = 0x3f800000;
            auVar60 = vfnmadd213ps_fma(auVar52,auVar58,auVar107);
            auVar60 = vfmadd132ps_fma(ZEXT1632(auVar60),auVar52,auVar52);
            local_11c0._28_4_ = 0x3f800000;
            local_11c0._0_28_ =
                 ZEXT1628(CONCAT412(auVar60._12_4_ * (auVar61._12_4_ + auVar61._12_4_),
                                    CONCAT48(auVar60._8_4_ * (auVar61._8_4_ + auVar61._8_4_),
                                             CONCAT44(auVar60._4_4_ *
                                                      (auVar61._4_4_ + auVar61._4_4_),
                                                      auVar60._0_4_ *
                                                      (auVar61._0_4_ + auVar61._0_4_)))));
            auVar89 = ZEXT3264(local_11c0);
            uVar111 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar77._4_4_ = uVar111;
            auVar77._0_4_ = uVar111;
            auVar77._8_4_ = uVar111;
            auVar77._12_4_ = uVar111;
            auVar77._16_4_ = uVar111;
            auVar77._20_4_ = uVar111;
            auVar77._24_4_ = uVar111;
            auVar77._28_4_ = uVar111;
            uVar111 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar115._4_4_ = uVar111;
            auVar115._0_4_ = uVar111;
            auVar115._8_4_ = uVar111;
            auVar115._12_4_ = uVar111;
            auVar115._16_4_ = uVar111;
            auVar115._20_4_ = uVar111;
            auVar115._24_4_ = uVar111;
            auVar115._28_4_ = uVar111;
            auVar49 = ZEXT3264(auVar115);
            auVar52 = vcmpps_avx(auVar77,local_11c0,2);
            auVar70 = vcmpps_avx(local_11c0,auVar115,2);
            auVar52 = vandps_avx(auVar70,auVar52);
            auVar60 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
            auVar50 = vpand_avx(auVar60,auVar50);
            auVar52 = vpmovsxwd_avx2(auVar50);
            if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar52 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar52 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar52 >> 0x7f,0) != '\0') ||
                  (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar52 >> 0xbf,0) != '\0') ||
                (auVar52 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar52[0x1f] < '\0') {
              auVar52 = vcmpps_avx(auVar58,_DAT_01faff00,4);
              auVar60 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
              auVar50 = vpand_avx(auVar50,auVar60);
              local_14e0 = vpmovsxwd_avx2(auVar50);
              if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_14e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_14e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_14e0 >> 0x7f,0) != '\0') ||
                    (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_14e0 >> 0xbf,0) != '\0') ||
                  (local_14e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_14e0[0x1f] < '\0') {
                uStack_12d0 = 0;
                uStack_12cc = 0;
                uStack_12c8 = 0;
                uStack_12c4 = 0;
                local_1220 = local_14e0;
                local_1140 = local_1100;
                pSVar41 = context->scene;
                auVar52 = vrcpps_avx(local_12a0);
                auVar98._8_4_ = 0x3f800000;
                auVar98._0_8_ = 0x3f8000003f800000;
                auVar98._12_4_ = 0x3f800000;
                auVar98._16_4_ = 0x3f800000;
                auVar98._20_4_ = 0x3f800000;
                auVar98._24_4_ = 0x3f800000;
                auVar98._28_4_ = 0x3f800000;
                auVar60 = vfnmadd213ps_fma(local_12a0,auVar52,auVar98);
                auVar60 = vfmadd132ps_fma(ZEXT1632(auVar60),auVar52,auVar52);
                auVar78._8_4_ = 0x219392ef;
                auVar78._0_8_ = 0x219392ef219392ef;
                auVar78._12_4_ = 0x219392ef;
                auVar78._16_4_ = 0x219392ef;
                auVar78._20_4_ = 0x219392ef;
                auVar78._24_4_ = 0x219392ef;
                auVar78._28_4_ = 0x219392ef;
                auVar52 = vcmpps_avx(local_10e0,auVar78,5);
                auVar52 = vandps_avx(auVar52,ZEXT1632(auVar60));
                auVar29._4_4_ = local_12e0._4_4_ * auVar52._4_4_;
                auVar29._0_4_ = local_12e0._0_4_ * auVar52._0_4_;
                auVar29._8_4_ = local_12e0._8_4_ * auVar52._8_4_;
                auVar29._12_4_ = local_12e0._12_4_ * auVar52._12_4_;
                auVar29._16_4_ = auVar52._16_4_ * 0.0;
                auVar29._20_4_ = auVar52._20_4_ * 0.0;
                auVar29._24_4_ = auVar52._24_4_ * 0.0;
                auVar29._28_4_ = 0;
                auVar70 = vminps_avx(auVar29,auVar98);
                auVar30._4_4_ = auVar51._4_4_ * auVar52._4_4_;
                auVar30._0_4_ = auVar51._0_4_ * auVar52._0_4_;
                auVar30._8_4_ = auVar51._8_4_ * auVar52._8_4_;
                auVar30._12_4_ = auVar51._12_4_ * auVar52._12_4_;
                auVar30._16_4_ = auVar52._16_4_ * 0.0;
                auVar30._20_4_ = auVar52._20_4_ * 0.0;
                auVar30._24_4_ = auVar52._24_4_ * 0.0;
                auVar30._28_4_ = local_1080._28_4_;
                auVar52 = vminps_avx(auVar30,auVar98);
                auVar58 = vsubps_avx(auVar98,auVar70);
                auVar53 = vsubps_avx(auVar98,auVar52);
                local_11e0 = vblendvps_avx(auVar52,auVar58,local_1100);
                local_1200 = vblendvps_avx(auVar70,auVar53,local_1100);
                local_11a0[0] = local_1280._0_4_ * (float)local_1120._0_4_;
                local_11a0[1] = local_1280._4_4_ * (float)local_1120._4_4_;
                local_11a0[2] = local_1280._8_4_ * fStack_1118;
                local_11a0[3] = local_1280._12_4_ * fStack_1114;
                fStack_1190 = local_1280._16_4_ * fStack_1110;
                fStack_118c = local_1280._20_4_ * fStack_110c;
                fStack_1188 = local_1280._24_4_ * fStack_1108;
                uStack_1184 = local_1200._28_4_;
                local_1180[0] = (float)local_1120._0_4_ * local_1260._0_4_;
                local_1180[1] = (float)local_1120._4_4_ * local_1260._4_4_;
                local_1180[2] = fStack_1118 * local_1260._8_4_;
                local_1180[3] = fStack_1114 * local_1260._12_4_;
                fStack_1170 = fStack_1110 * local_1260._16_4_;
                fStack_116c = fStack_110c * local_1260._20_4_;
                fStack_1168 = fStack_1108 * local_1260._24_4_;
                uStack_1164 = local_11e0._28_4_;
                local_1160[0] = (float)local_1120._0_4_ * fVar95;
                local_1160[1] = (float)local_1120._4_4_ * fVar82;
                local_1160[2] = fStack_1118 * fVar83;
                local_1160[3] = fStack_1114 * fVar84;
                fStack_1150 = fStack_1110 * fVar85;
                fStack_114c = fStack_110c * fVar86;
                fStack_1148 = fStack_1108 * fVar87;
                uStack_1144 = uStack_1104;
                auVar52 = vpmovsxwd_avx2(auVar50);
                auVar65._8_4_ = 0x7f800000;
                auVar65._0_8_ = 0x7f8000007f800000;
                auVar65._12_4_ = 0x7f800000;
                auVar65._16_4_ = 0x7f800000;
                auVar65._20_4_ = 0x7f800000;
                auVar65._24_4_ = 0x7f800000;
                auVar65._28_4_ = 0x7f800000;
                auVar52 = vblendvps_avx(auVar65,local_11c0,auVar52);
                auVar70 = vshufps_avx(auVar52,auVar52,0xb1);
                auVar70 = vminps_avx(auVar52,auVar70);
                auVar58 = vshufpd_avx(auVar70,auVar70,5);
                auVar70 = vminps_avx(auVar70,auVar58);
                auVar58 = vpermpd_avx2(auVar70,0x4e);
                auVar70 = vminps_avx(auVar70,auVar58);
                auVar52 = vcmpps_avx(auVar52,auVar70,0);
                auVar51 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
                auVar51 = vpand_avx(auVar51,auVar50);
                auVar52 = vpmovsxwd_avx2(auVar51);
                auVar93 = ZEXT3264(auVar52);
                if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar52 >> 0x7f,0) == '\0') &&
                      (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar52 >> 0xbf,0) == '\0') &&
                    (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar52[0x1f]) {
                  auVar93 = ZEXT3264(local_14e0);
                }
LAB_00515556:
                uVar32 = vmovmskps_avx(auVar93._0_32_);
                uVar36 = 0;
                for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
                  uVar36 = uVar36 + 1;
                }
                uVar35 = CONCAT44(0,uVar36);
                uVar36 = *(uint *)((long)&local_fc0 + uVar35 * 4);
                pGVar5 = (pSVar41->geometries).items[uVar36].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_14e0 + uVar35 * 4) = 0;
                }
                else {
                  local_1500._0_8_ = uVar35;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar111 = *(undefined4 *)(local_1200 + uVar35 * 4);
                    uVar3 = *(undefined4 *)(local_11e0 + uVar35 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11c0 + uVar35 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = local_11a0[uVar35];
                    *(float *)(ray + k * 4 + 0xd0) = local_1180[uVar35];
                    *(float *)(ray + k * 4 + 0xe0) = local_1160[uVar35];
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar111;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_13a0 + uVar35 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar36;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_005159d2;
                  }
                  uVar111 = *(undefined4 *)(local_1200 + uVar35 * 4);
                  local_1340._4_4_ = uVar111;
                  local_1340._0_4_ = uVar111;
                  local_1340._8_4_ = uVar111;
                  local_1340._12_4_ = uVar111;
                  local_1330 = *(undefined4 *)(local_11e0 + uVar35 * 4);
                  local_1310._4_4_ = uVar36;
                  local_1310._0_4_ = uVar36;
                  local_1310._8_4_ = uVar36;
                  local_1310._12_4_ = uVar36;
                  uVar111 = *(undefined4 *)((long)&local_13a0 + uVar35 * 4);
                  auVar69._4_4_ = uVar111;
                  auVar69._0_4_ = uVar111;
                  auVar69._8_4_ = uVar111;
                  auVar69._12_4_ = uVar111;
                  fVar106 = local_11a0[uVar35];
                  fVar108 = local_1180[uVar35];
                  local_1360._4_4_ = fVar108;
                  local_1360._0_4_ = fVar108;
                  local_1360._8_4_ = fVar108;
                  local_1360._12_4_ = fVar108;
                  fVar108 = local_1160[uVar35];
                  local_1350._4_4_ = fVar108;
                  local_1350._0_4_ = fVar108;
                  local_1350._8_4_ = fVar108;
                  local_1350._12_4_ = fVar108;
                  local_1370[0] = (RTCHitN)SUB41(fVar106,0);
                  local_1370[1] = (RTCHitN)(char)((uint)fVar106 >> 8);
                  local_1370[2] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
                  local_1370[3] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
                  local_1370[4] = (RTCHitN)SUB41(fVar106,0);
                  local_1370[5] = (RTCHitN)(char)((uint)fVar106 >> 8);
                  local_1370[6] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
                  local_1370[7] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
                  local_1370[8] = (RTCHitN)SUB41(fVar106,0);
                  local_1370[9] = (RTCHitN)(char)((uint)fVar106 >> 8);
                  local_1370[10] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
                  local_1370[0xb] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
                  local_1370[0xc] = (RTCHitN)SUB41(fVar106,0);
                  local_1370[0xd] = (RTCHitN)(char)((uint)fVar106 >> 8);
                  local_1370[0xe] = (RTCHitN)(char)((uint)fVar106 >> 0x10);
                  local_1370[0xf] = (RTCHitN)(char)((uint)fVar106 >> 0x18);
                  uStack_132c = local_1330;
                  uStack_1328 = local_1330;
                  uStack_1324 = local_1330;
                  local_1320 = auVar69;
                  vpcmpeqd_avx2(ZEXT1632(local_1340),ZEXT1632(local_1340));
                  uStack_12fc = context->user->instID[0];
                  local_1300 = uStack_12fc;
                  uStack_12f8 = uStack_12fc;
                  uStack_12f4 = uStack_12fc;
                  uStack_12f0 = context->user->instPrimID[0];
                  uStack_12ec = uStack_12f0;
                  uStack_12e8 = uStack_12f0;
                  uStack_12e4 = uStack_12f0;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11c0 + uVar35 * 4);
                  local_1560 = *local_1550;
                  local_1530.valid = (int *)local_1560;
                  local_1530.geometryUserPtr = pGVar5->userPtr;
                  local_1530.context = context->user;
                  local_1530.hit = local_1370;
                  local_1530.N = 4;
                  local_1460 = auVar89._0_32_;
                  local_1480 = auVar49._0_32_;
                  local_14a0._0_8_ = pSVar41;
                  local_1530.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar5->intersectionFilterN)(&local_1530);
                    auVar49 = ZEXT3264(local_1480);
                    auVar89 = ZEXT3264(local_1460);
                    pSVar41 = (Scene *)local_14a0._0_8_;
                  }
                  if (local_1560 == (undefined1  [16])0x0) {
                    auVar51 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar51 = auVar51 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&local_1530);
                      auVar49 = ZEXT3264(local_1480);
                      auVar89 = ZEXT3264(local_1460);
                      pSVar41 = (Scene *)local_14a0._0_8_;
                    }
                    auVar50 = vpcmpeqd_avx(local_1560,_DAT_01f7aa10);
                    auVar60 = vpcmpeqd_avx(auVar69,auVar69);
                    auVar51 = auVar50 ^ auVar60;
                    if (local_1560 != (undefined1  [16])0x0) {
                      auVar50 = auVar50 ^ auVar60;
                      auVar60 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])local_1530.hit);
                      *(undefined1 (*) [16])(local_1530.ray + 0xc0) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_1530.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0xd0) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_1530.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0xe0) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_1530.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0xf0) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_1530.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x100) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_1530.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x110) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_1530.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x120) = auVar60;
                      auVar60 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_1530.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x130) = auVar60;
                      auVar50 = vmaskmovps_avx(auVar50,*(undefined1 (*) [16])(local_1530.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_1530.ray + 0x140) = auVar50;
                    }
                  }
                  auVar45._8_8_ = 0x100000001;
                  auVar45._0_8_ = 0x100000001;
                  if ((auVar45 & auVar51) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = auVar49._0_4_;
                  }
                  else {
                    auVar49 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_14e0 + local_1500._0_8_ * 4) = 0;
                  uVar111 = auVar49._0_4_;
                  auVar48._4_4_ = uVar111;
                  auVar48._0_4_ = uVar111;
                  auVar48._8_4_ = uVar111;
                  auVar48._12_4_ = uVar111;
                  auVar48._16_4_ = uVar111;
                  auVar48._20_4_ = uVar111;
                  auVar48._24_4_ = uVar111;
                  auVar48._28_4_ = uVar111;
                  auVar52 = vcmpps_avx(auVar89._0_32_,auVar48,2);
                  local_14e0 = vandps_avx(auVar52,local_14e0);
                }
                auVar93 = ZEXT3264(local_14e0);
                if ((((((((local_14e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_14e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_14e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_14e0 >> 0x7f,0) == '\0') &&
                      (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_14e0 >> 0xbf,0) == '\0') &&
                    (local_14e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_14e0[0x1f]) goto LAB_005159d2;
                auVar59._8_4_ = 0x7f800000;
                auVar59._0_8_ = 0x7f8000007f800000;
                auVar59._12_4_ = 0x7f800000;
                auVar59._16_4_ = 0x7f800000;
                auVar59._20_4_ = 0x7f800000;
                auVar59._24_4_ = 0x7f800000;
                auVar59._28_4_ = 0x7f800000;
                auVar52 = vblendvps_avx(auVar59,auVar89._0_32_,local_14e0);
                auVar70 = vshufps_avx(auVar52,auVar52,0xb1);
                auVar70 = vminps_avx(auVar52,auVar70);
                auVar58 = vshufpd_avx(auVar70,auVar70,5);
                auVar70 = vminps_avx(auVar70,auVar58);
                auVar58 = vpermpd_avx2(auVar70,0x4e);
                auVar70 = vminps_avx(auVar70,auVar58);
                auVar52 = vcmpps_avx(auVar52,auVar70,0);
                auVar70 = local_14e0 & auVar52;
                if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar70 >> 0x7f,0) != '\0') ||
                      (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar70 >> 0xbf,0) != '\0') ||
                    (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar70[0x1f] < '\0') {
                  auVar52 = vandps_avx(auVar52,local_14e0);
                  auVar93 = ZEXT3264(auVar52);
                }
                goto LAB_00515556;
              }
            }
          }
LAB_005159d2:
          lVar39 = lVar39 + 1;
        } while (lVar39 != local_1548);
      }
      uVar111 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar49 = ZEXT1664(CONCAT412(uVar111,CONCAT48(uVar111,CONCAT44(uVar111,uVar111))));
      auVar93 = ZEXT1664(local_13b0);
      auVar94 = ZEXT1664(local_13c0);
      auVar99 = ZEXT1664(local_13d0);
      auVar89 = ZEXT1664(local_14b0);
      fVar106 = local_13e0;
      fVar108 = fStack_13dc;
      fVar109 = fStack_13d8;
      fVar110 = fStack_13d4;
      fVar112 = local_13f0;
      fVar116 = fStack_13ec;
      fVar117 = fStack_13e8;
      fVar95 = fStack_13e4;
      fVar82 = local_1400;
      fVar83 = fStack_13fc;
      fVar84 = fStack_13f8;
      fVar85 = fStack_13f4;
      fVar86 = local_1410;
      fVar87 = fStack_140c;
      fVar119 = fStack_1408;
      fVar120 = fStack_1404;
      fVar121 = local_1420;
      fVar123 = fStack_141c;
      fVar124 = fStack_1418;
      fVar125 = fStack_1414;
      fVar126 = local_1430;
      fVar128 = fStack_142c;
      fVar129 = fStack_1428;
      fVar130 = fStack_1424;
    }
    if (pauVar33 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }